

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void nn_timer_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_timer *timer;
  nn_fsm_event *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (*(int *)(local_28 + 0x58) == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
              ,0x8d);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_28 + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
              ,0x8a);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_28 + 0x58) = 2;
    nn_worker_execute((nn_worker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (nn_worker_task *)in_stack_ffffffffffffffb8);
  }
  else {
    if (*(int *)(local_28 + 0x58) != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
              ,0xaf);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 1) {
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_WORKER_TASK_EXECUTE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0x95);
        fflush(_stderr);
        nn_err_abort();
      }
      if (*(int *)(local_28 + 0xe0) < 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","timer->timeout >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0x96);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_worker_add_timer((nn_worker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                          ,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          (nn_worker_timer *)0x146adf);
      *(undefined4 *)(local_28 + 0xe0) = 0xffffffff;
    }
    else {
      if (in_RCX != local_28 + 0x90) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0xa9);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0xa6);
        fflush(_stderr);
        nn_err_abort();
      }
      if (*(int *)(local_28 + 0xe0) != -1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","timer->timeout == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0xa1);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,0);
    }
  }
  return;
}

Assistant:

static void nn_timer_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    switch (timer->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_TIMER_STATE_IDLE:
        switch (src) {
        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:

                /*  Send start event to the worker thread. */
                timer->state = NN_TIMER_STATE_ACTIVE;
                nn_worker_execute (timer->worker, &timer->start_task);
                return;
            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        default:
            nn_fsm_bad_source (timer->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_TIMER_STATE_ACTIVE:
        if (src == NN_TIMER_SRC_START_TASK) {
            nn_assert (type == NN_WORKER_TASK_EXECUTE);
            nn_assert (timer->timeout >= 0);
            nn_worker_add_timer (timer->worker, timer->timeout,
                &timer->wtimer);
            timer->timeout = -1;
            return;
        }
        if (srcptr == &timer->wtimer) {
            switch (type) {
            case NN_WORKER_TIMER_TIMEOUT:

                /*  Notify the user about the timeout. */
                nn_assert (timer->timeout == -1);
                nn_fsm_raise (&timer->fsm, &timer->done, NN_TIMER_TIMEOUT);
                return;

            default:
                nn_fsm_bad_action (timer->state, src, type);
            }
        }
        nn_fsm_bad_source (timer->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (timer->state, src, type);
    }
}